

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

void ourWriteOut(char *writeinfo,per_transfer *per,CURLcode per_result)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  undefined8 *puVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  FILE *__stream;
  
  bVar7 = false;
  __stream = _stdout;
LAB_0011cff3:
  writeinfo = writeinfo + 1;
  do {
    pcVar3 = writeinfo + -1;
    if (pcVar3 == (char *)0x0) {
      return;
    }
    cVar1 = *pcVar3;
    iVar6 = (int)cVar1;
    if (iVar6 == 0 || bVar7) {
      return;
    }
    if (cVar1 != '%') {
      if (cVar1 == '\\') {
        cVar1 = *writeinfo;
        iVar6 = 0x5c;
        if (cVar1 != '\0') {
          if (cVar1 == 't') {
            iVar6 = 9;
          }
          else {
            iVar6 = 0xd;
            if (cVar1 != 'r') {
              if (cVar1 != 'n') {
                iVar6 = 0x5c;
                goto LAB_0011d059;
              }
              iVar6 = 10;
            }
          }
          goto LAB_0011d137;
        }
      }
LAB_0011d0a3:
      fputc(iVar6,__stream);
      bVar7 = false;
      goto LAB_0011cff3;
    }
    cVar1 = *writeinfo;
    if (cVar1 != '{') {
      if (cVar1 == '\0') goto LAB_0011d0a3;
      iVar6 = 0x25;
      if (cVar1 != '%') {
LAB_0011d059:
        fputc(iVar6,__stream);
        iVar6 = (int)*writeinfo;
      }
LAB_0011d137:
      fputc(iVar6,__stream);
      writeinfo = writeinfo + 1;
      bVar7 = false;
      goto LAB_0011cff3;
    }
    pcVar3 = strchr(pcVar3,0x7d);
    if (pcVar3 != (char *)0x0) break;
    fputs("%{",__stream);
    writeinfo = writeinfo + 2;
  } while( true );
  cVar1 = *pcVar3;
  *pcVar3 = '\0';
  lVar8 = 0x2b;
  lVar2 = 0x12e8f8;
  do {
    lVar5 = lVar2;
    lVar8 = lVar8 + -1;
    if (lVar8 == 0) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",writeinfo + 1);
      bVar7 = false;
      goto LAB_0011d16c;
    }
    iVar6 = curl_strequal(writeinfo + 1,*(undefined8 *)(lVar5 + 0x18));
    lVar2 = lVar5 + 0x18;
  } while (iVar6 == 0);
  iVar6 = *(int *)(lVar5 + 0x20);
  if (iVar6 == 0xf) {
    ourWriteOutJSON((FILE *)__stream,variables,per,per_result);
    bVar7 = false;
  }
  else {
    bVar7 = per_result == CURLE_OK;
    if (iVar6 != 0x15) {
      if (iVar6 == 0x26) {
        puVar4 = (undefined8 *)&stderr;
      }
      else {
        if (iVar6 != 0x27) {
          (**(code **)(lVar5 + 0x28))(__stream,lVar5 + 0x18,per,per_result,0);
          bVar7 = false;
          goto LAB_0011d16c;
        }
        puVar4 = (undefined8 *)&stdout;
      }
      __stream = (FILE *)*puVar4;
      bVar7 = false;
    }
  }
LAB_0011d16c:
  writeinfo = pcVar3 + 1;
  *pcVar3 = cVar1;
  goto LAB_0011cff3;
}

Assistant:

void ourWriteOut(const char *writeinfo, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  bool done = FALSE;

  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* null-terminate */
          for(i = 0; variables[i].name; i++) {
            if(curl_strequal(ptr, variables[i].name)) {
              match = TRUE;
              switch(variables[i].id) {
              case VAR_ONERROR:
                if(per_result == CURLE_OK)
                  /* this isn't error so skip the rest */
                  done = TRUE;
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              case VAR_JSON:
                ourWriteOutJSON(stream, variables, per, per_result);
                break;
              default:
                (void)variables[i].writefunc(stream, &variables[i],
                                             per, per_result, false);
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
}